

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O0

MtrNode * Mtr_InitGroupTree(int lower,int size)

{
  MtrNode *root;
  int size_local;
  int lower_local;
  
  _size_local = Mtr_InitTree();
  if (_size_local == (MtrNode *)0x0) {
    _size_local = (MtrNode *)0x0;
  }
  else {
    _size_local->flags = 0;
    _size_local->low = lower;
    _size_local->size = size;
  }
  return _size_local;
}

Assistant:

MtrNode *
Mtr_InitGroupTree(
  int  lower,
  int  size)
{
    MtrNode *root;

    root = Mtr_InitTree();
    if (root == NULL) return(NULL);
    root->flags = MTR_DEFAULT;
    root->low = lower;
    root->size = size;
    return(root);

}